

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void opj_mqc_segmark_enc(opj_mqc_t *mqc)

{
  OPJ_UINT32 *pOVar1;
  opj_mqc_state_t **ppoVar2;
  opj_mqc_state_t *poVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  mqc->curctx = mqc->ctxs + 0x12;
  uVar4 = mqc->a;
  uVar6 = 1;
  do {
    ppoVar2 = mqc->curctx;
    poVar3 = *ppoVar2;
    uVar5 = poVar3->qeval;
    uVar4 = uVar4 - uVar5;
    if (poVar3->mps == (uVar6 & 1)) {
      mqc->a = uVar4;
      if ((short)uVar4 < 0) {
        mqc->c = mqc->c + uVar5;
      }
      else {
        if (uVar5 <= uVar4) {
          mqc->c = mqc->c + uVar5;
          uVar5 = uVar4;
        }
        *ppoVar2 = poVar3->nmps;
        uVar4 = uVar5;
        do {
          uVar4 = uVar4 * 2;
          mqc->a = uVar4;
          mqc->c = mqc->c << 1;
          pOVar1 = &mqc->ct;
          *pOVar1 = *pOVar1 - 1;
          if (*pOVar1 == 0) {
            opj_mqc_byteout(mqc);
            uVar4 = mqc->a;
          }
        } while (-1 < (short)uVar4);
      }
    }
    else {
      if (uVar4 < uVar5) {
        mqc->c = mqc->c + uVar5;
        uVar5 = uVar4;
      }
      uVar4 = uVar5;
      *ppoVar2 = poVar3->nlps;
      do {
        uVar4 = uVar4 * 2;
        mqc->a = uVar4;
        mqc->c = mqc->c << 1;
        pOVar1 = &mqc->ct;
        *pOVar1 = *pOVar1 - 1;
        if (*pOVar1 == 0) {
          opj_mqc_byteout(mqc);
          uVar4 = mqc->a;
        }
      } while (-1 < (short)uVar4);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 5);
  return;
}

Assistant:

void opj_mqc_segmark_enc(opj_mqc_t *mqc)
{
    OPJ_UINT32 i;
    opj_mqc_setcurctx(mqc, 18);

    for (i = 1; i < 5; i++) {
        opj_mqc_encode(mqc, i % 2);
    }
}